

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

FT_Error psh_hint_table_init(PSH_Hint_Table table,PS_Hint_Table hints,PS_Mask_Table hint_masks,
                            PS_Mask_Table counter_masks,FT_Memory memory)

{
  FT_UInt FVar1;
  PS_Hint pPVar2;
  PSH_Hint_conflict *ppPVar3;
  PSH_Hint_conflict pPVar4;
  PSH_ZoneRec *pPVar5;
  long lVar6;
  PS_Mask pPVar7;
  uint uVar8;
  uint uVar9;
  FT_UInt FVar10;
  byte *pbVar11;
  FT_UInt idx_00;
  FT_UInt idx;
  int local_34 [2];
  FT_Error error;
  
  uVar8 = hints->num_hints;
  ppPVar3 = (PSH_Hint_conflict *)
            ft_mem_realloc((FT_Memory)counter_masks,8,0,(ulong)(uVar8 * 2),(void *)0x0,local_34);
  table->sort = ppPVar3;
  if (local_34[0] == 0) {
    pPVar4 = (PSH_Hint_conflict)
             ft_mem_realloc((FT_Memory)counter_masks,0x30,0,(ulong)uVar8,(void *)0x0,local_34);
    table->hints = pPVar4;
    if (local_34[0] == 0) {
      pPVar5 = (PSH_ZoneRec *)
               ft_mem_realloc((FT_Memory)counter_masks,0x20,0,(ulong)(uVar8 * 2 | 1),(void *)0x0,
                              local_34);
      table->zones = pPVar5;
      if (local_34[0] == 0) {
        table->max_hints = uVar8;
        table->sort_global = table->sort + uVar8;
        table->num_hints = 0;
        table->num_zones = 0;
        table->zone = (PSH_Zone)0x0;
        if (uVar8 != 0) {
          pPVar2 = hints->hints;
          pPVar4 = table->hints;
          lVar6 = 0;
          uVar9 = uVar8;
          do {
            (&pPVar4->org_pos)[lVar6] = *(FT_Int *)((long)&pPVar2->pos + lVar6);
            (&pPVar4->org_len)[lVar6] = *(FT_Int *)((long)&pPVar2->len + lVar6);
            (&pPVar4->flags)[lVar6] = *(FT_UInt *)((long)&pPVar2->flags + lVar6);
            lVar6 = lVar6 + 0xc;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        uVar9 = 0;
        if (hint_masks != (PS_Mask_Table)0x0) {
          pPVar7 = hint_masks->masks;
          FVar10 = hint_masks->num_masks;
          table->hint_masks = hint_masks;
          uVar9 = 0;
          if (FVar10 != 0) {
            do {
              FVar1 = pPVar7->num_bits;
              if (FVar1 != 0) {
                pbVar11 = pPVar7->bytes;
                uVar9 = 0;
                idx_00 = 0;
                uVar8 = 0;
                do {
                  if (uVar9 == 0) {
                    uVar8 = (uint)*pbVar11;
                    pbVar11 = pbVar11 + 1;
                    uVar9 = 0x80;
                  }
                  if ((uVar9 & uVar8) != 0) {
                    psh_hint_table_record(table,idx_00);
                  }
                  uVar9 = uVar9 >> 1;
                  idx_00 = idx_00 + 1;
                } while (FVar1 != idx_00);
              }
              pPVar7 = pPVar7 + 1;
              FVar10 = FVar10 - 1;
            } while (FVar10 != 0);
            uVar8 = table->max_hints;
            uVar9 = table->num_hints;
          }
        }
        if (uVar8 != 0 && uVar9 != uVar8) {
          FVar10 = 0;
          do {
            psh_hint_table_record(table,FVar10);
            FVar10 = FVar10 + 1;
          } while (uVar8 != FVar10);
        }
      }
    }
  }
  return local_34[0];
}

Assistant:

static FT_Error
  psh_hint_table_init( PSH_Hint_Table  table,
                       PS_Hint_Table   hints,
                       PS_Mask_Table   hint_masks,
                       PS_Mask_Table   counter_masks,
                       FT_Memory       memory )
  {
    FT_UInt   count;
    FT_Error  error;

    FT_UNUSED( counter_masks );


    count = hints->num_hints;

    /* allocate our tables */
    if ( FT_NEW_ARRAY( table->sort,  2 * count     ) ||
         FT_NEW_ARRAY( table->hints,     count     ) ||
         FT_NEW_ARRAY( table->zones, 2 * count + 1 ) )
      goto Exit;

    table->max_hints   = count;
    table->sort_global = table->sort + count;
    table->num_hints   = 0;
    table->num_zones   = 0;
    table->zone        = NULL;

    /* initialize the `table->hints' array */
    {
      PSH_Hint  write = table->hints;
      PS_Hint   read  = hints->hints;


      for ( ; count > 0; count--, write++, read++ )
      {
        write->org_pos = read->pos;
        write->org_len = read->len;
        write->flags   = read->flags;
      }
    }

    /* we now need to determine the initial `parent' stems; first  */
    /* activate the hints that are given by the initial hint masks */
    if ( hint_masks )
    {
      PS_Mask  mask = hint_masks->masks;


      count             = hint_masks->num_masks;
      table->hint_masks = hint_masks;

      for ( ; count > 0; count--, mask++ )
        psh_hint_table_record_mask( table, mask );
    }

    /* finally, do a linear parse in case some hints were left alone */
    if ( table->num_hints != table->max_hints )
    {
      FT_UInt  idx;


      FT_TRACE0(( "psh_hint_table_init: missing/incorrect hint masks\n" ));

      count = table->max_hints;
      for ( idx = 0; idx < count; idx++ )
        psh_hint_table_record( table, idx );
    }

  Exit:
    return error;
  }